

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O1

void __thiscall
duckdb::HashJoinLocalSinkState::~HashJoinLocalSinkState(HashJoinLocalSinkState *this)

{
  _Head_base<0UL,_duckdb::JoinFilterLocalState_*,_false> this_00;
  pointer ppEVar1;
  
  (this->super_LocalSinkState)._vptr_LocalSinkState =
       (_func_int **)&PTR__HashJoinLocalSinkState_024a5ac8;
  this_00._M_head_impl =
       (this->local_filter_state).
       super_unique_ptr<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::JoinFilterLocalState_*,_std::default_delete<duckdb::JoinFilterLocalState>_>
       .super__Head_base<0UL,_duckdb::JoinFilterLocalState_*,_false>._M_head_impl;
  if (this_00._M_head_impl != (JoinFilterLocalState *)0x0) {
    JoinFilterLocalState::~JoinFilterLocalState(this_00._M_head_impl);
    operator_delete(this_00._M_head_impl);
  }
  (this->local_filter_state).
  super_unique_ptr<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::JoinFilterLocalState_*,_std::default_delete<duckdb::JoinFilterLocalState>_>
  .super__Head_base<0UL,_duckdb::JoinFilterLocalState_*,_false>._M_head_impl =
       (JoinFilterLocalState *)0x0;
  ::std::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>::~unique_ptr
            (&(this->hash_table).
              super_unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>);
  DataChunk::~DataChunk(&this->payload_chunk);
  DataChunk::~DataChunk(&this->join_keys);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
  ::~vector(&(this->join_key_executor).states.
             super_vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
           );
  ppEVar1 = (this->join_key_executor).expressions.
            super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
            super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar1 != (pointer)0x0) {
    operator_delete(ppEVar1);
  }
  PartitionedTupleDataAppendState::~PartitionedTupleDataAppendState(&this->append_state);
  (this->super_LocalSinkState)._vptr_LocalSinkState = (_func_int **)&PTR__LocalSinkState_024811c0;
  ::std::vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>::~vector
            (&(this->super_LocalSinkState).partition_info.partition_data.
              super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
            );
  operator_delete(this);
  return;
}

Assistant:

HashJoinLocalSinkState(const PhysicalHashJoin &op, ClientContext &context, HashJoinGlobalSinkState &gstate)
	    : join_key_executor(context) {
		auto &allocator = BufferAllocator::Get(context);

		for (auto &cond : op.conditions) {
			join_key_executor.AddExpression(*cond.right);
		}
		join_keys.Initialize(allocator, op.condition_types);

		if (!op.payload_columns.col_types.empty()) {
			payload_chunk.Initialize(allocator, op.payload_columns.col_types);
		}

		hash_table = op.InitializeHashTable(context);
		hash_table->GetSinkCollection().InitializeAppendState(append_state);

		gstate.active_local_states++;

		if (op.filter_pushdown) {
			local_filter_state = op.filter_pushdown->GetLocalState(*gstate.global_filter_state);
		}
	}